

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::
numeric_specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
::check_sign(numeric_specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
             *this)

{
  uint uVar1;
  specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  *psVar2;
  type tVar3;
  size_type __dnew;
  string local_70;
  string local_50;
  size_type local_30;
  
  tVar3 = this->arg_type_;
  uVar1 = tVar3 - named_arg_type;
  if (0xb < uVar1) {
    psVar2 = this->error_handler_;
    local_30 = 0x2a;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_30);
    local_50.field_2._M_allocated_capacity = local_30;
    builtin_strncpy(local_50._M_dataplus._M_p,"format specifier requires numeric argument",0x2a);
    local_50._M_string_length = local_30;
    local_50._M_dataplus._M_p[local_30] = '\0';
    specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
    ::on_error(psVar2,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    tVar3 = this->arg_type_;
    uVar1 = tVar3 - named_arg_type;
  }
  if ((uVar1 < 9) &&
     ((char_type < tVar3 || ((0x214U >> (tVar3 & (custom_type|pointer_type)) & 1) == 0)))) {
    psVar2 = this->error_handler_;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"format specifier requires signed argument","");
    specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
    ::on_error(psVar2,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

FMT_CONSTEXPR void check_sign() {
    require_numeric_argument();
    if (is_integral_type(arg_type_) && arg_type_ != int_type &&
        arg_type_ != long_long_type && arg_type_ != internal::char_type) {
      error_handler_.on_error("format specifier requires signed argument");
    }
  }